

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O0

void __thiscall material_table::material_table(material_table *this,material_table *o)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  material_entry *__p;
  element_type *__dest;
  element_type *__src;
  material_entry *local_60;
  shared_ptr<material_entry[]> local_28;
  material_table *local_18;
  material_table *o_local;
  material_table *this_local;
  
  local_18 = o;
  o_local = this;
  std::shared_ptr<material_entry[]>::shared_ptr(&this->entries);
  uVar1 = this->count;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar3 = SUB168(auVar2 * ZEXT816(0x28),0);
  if (SUB168(auVar2 * ZEXT816(0x28),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  __p = (material_entry *)operator_new__(uVar3);
  if (uVar1 != 0) {
    local_60 = __p;
    do {
      memset(local_60,0,0x28);
      material_entry::material_entry(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != __p + uVar1);
  }
  std::shared_ptr<material_entry[]>::shared_ptr<material_entry,void>(&local_28,__p);
  std::shared_ptr<material_entry[]>::operator=(&this->entries,&local_28);
  std::shared_ptr<material_entry[]>::~shared_ptr(&local_28);
  __dest = std::__shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->entries).
                       super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>);
  __src = std::__shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>::get
                    (&(local_18->entries).
                      super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>);
  memcpy(__dest,__src,this->count * 0x28);
  std::shared_ptr<material_entry[]>::operator=(&this->entries,&local_18->entries);
  this->sz_mb = local_18->sz_mb;
  this->count = local_18->count;
  return;
}

Assistant:

material_table::material_table(const material_table& o) {
	entries = std::shared_ptr<material_entry[]>(new material_entry[count]());
	std::memcpy(entries.get(), o.entries.get(), count * sizeof(material_entry));
	entries = o.entries;
	sz_mb = o.sz_mb;
	count = o.count;
}